

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::LambdaRefExpression::FindMatchingBinding
          (LambdaRefExpression *this,
          optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *lambda_bindings,
          string *column_name)

{
  pointer pcVar1;
  reference this_00;
  LambdaRefExpression *this_01;
  size_type __n;
  bool bVar2;
  string local_48;
  
  if (lambda_bindings->ptr == (vector<duckdb::DummyBinding,_true> *)0x0) {
    this_01 = (LambdaRefExpression *)0x0;
  }
  else {
    optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(lambda_bindings);
    __n = ((long)(lambda_bindings->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(lambda_bindings->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
    this_01 = (LambdaRefExpression *)0x0;
    do {
      bVar2 = __n == 0;
      __n = __n - 1;
      if (bVar2) goto LAB_0075496e;
      optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(lambda_bindings);
      this_00 = vector<duckdb::DummyBinding,_true>::operator[](lambda_bindings->ptr,__n);
      bVar2 = Binding::HasMatchingBinding(&this_00->super_Binding,column_name);
    } while (!bVar2);
    this_01 = (LambdaRefExpression *)operator_new(0x60);
    pcVar1 = (column_name->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + column_name->_M_string_length);
    LambdaRefExpression(this_01,__n,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
LAB_0075496e:
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_01;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression>
LambdaRefExpression::FindMatchingBinding(optional_ptr<vector<DummyBinding>> &lambda_bindings,
                                         const string &column_name) {

	// if this is a lambda parameter, then we temporarily add a BoundLambdaRef,
	// which we capture and remove later

	// inner lambda parameters have precedence over outer lambda parameters, and
	// lambda parameters have precedence over macros and columns

	if (lambda_bindings) {
		for (idx_t i = lambda_bindings->size(); i > 0; i--) {
			if ((*lambda_bindings)[i - 1].HasMatchingBinding(column_name)) {
				D_ASSERT((*lambda_bindings)[i - 1].alias.IsSet());
				return make_uniq<LambdaRefExpression>(i - 1, column_name);
			}
		}
	}

	return nullptr;
}